

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_parse_headers.c
# Opt level: O3

IHEVCD_ERROR_T ihevcd_parse_vps(codec_t *ps_codec)

{
  bitstrm_t *ps_bitstrm;
  vps_t *pvVar1;
  char cVar2;
  UWORD32 UVar3;
  WORD32 max_num_sub_layers;
  long lVar4;
  long lVar5;
  
  ps_bitstrm = &(ps_codec->s_parse).s_bitstrm;
  UVar3 = ihevcd_bits_get(ps_bitstrm,4);
  if (0xf < (int)UVar3) {
    (ps_codec->s_parse).i4_error_code = 0x3d0;
    return IHEVCD_UNSUPPORTED_VPS_ID;
  }
  pvVar1 = (ps_codec->s_parse).ps_vps_base;
  lVar4 = (long)(int)UVar3;
  pvVar1[lVar4].i1_vps_id = (WORD8)UVar3;
  lVar5 = lVar4;
  UVar3 = ihevcd_bits_get(ps_bitstrm,2);
  max_num_sub_layers = (WORD32)lVar5;
  if (UVar3 != 3) {
    __assert_fail("(value == 3)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/decoder/ihevcd_parse_headers.c"
                  ,0x4a1,"IHEVCD_ERROR_T ihevcd_parse_vps(codec_t *)");
  }
  ihevcd_bits_get(ps_bitstrm,6);
  UVar3 = ihevcd_bits_get(ps_bitstrm,3);
  cVar2 = (char)UVar3 + '\x01';
  pvVar1[lVar4].i1_vps_max_sub_layers = cVar2;
  if ('\x06' < cVar2) {
    __assert_fail("(ps_vps->i1_vps_max_sub_layers < 7)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/decoder/ihevcd_parse_headers.c"
                  ,0x4ab,"IHEVCD_ERROR_T ihevcd_parse_vps(codec_t *)");
  }
  UVar3 = ihevcd_bits_get(ps_bitstrm,1);
  pvVar1[lVar4].i1_vps_temporal_id_nesting_flag = (WORD8)UVar3;
  UVar3 = ihevcd_bits_get(ps_bitstrm,0x10);
  if (UVar3 != 0xffff) {
    __assert_fail("(value == 0xFFFF)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/decoder/ihevcd_parse_headers.c"
                  ,0x4b1,"IHEVCD_ERROR_T ihevcd_parse_vps(codec_t *)");
  }
  ihevcd_profile_tier_level
            (ps_bitstrm,&pvVar1[lVar4].s_ptl,pvVar1[lVar4].i1_vps_max_sub_layers + -1,
             max_num_sub_layers);
  UVar3 = ihevcd_bits_get(ps_bitstrm,1);
  pvVar1[lVar4].i1_sub_layer_ordering_info_present_flag = (char)UVar3;
  if ((char)UVar3 == '\0') {
    lVar5 = (long)pvVar1[lVar4].i1_vps_max_sub_layers + -1;
  }
  else {
    if (pvVar1[lVar4].i1_vps_max_sub_layers < '\x01') goto LAB_0011035c;
    lVar5 = 0;
  }
  do {
    UVar3 = ihevcd_uev(ps_bitstrm);
    pvVar1[lVar4].ai1_vps_max_dec_pic_buffering[lVar5] = (WORD8)UVar3;
    UVar3 = ihevcd_uev(ps_bitstrm);
    pvVar1[lVar4].ai1_vps_max_num_reorder_pics[lVar5] = (WORD8)UVar3;
    UVar3 = ihevcd_uev(ps_bitstrm);
    pvVar1[lVar4].ai1_vps_max_latency_increase[lVar5] = (WORD8)UVar3;
    lVar5 = lVar5 + 1;
  } while (lVar5 < pvVar1[lVar4].i1_vps_max_sub_layers);
LAB_0011035c:
  ihevcd_bits_get(ps_bitstrm,6);
  ihevcd_uev(ps_bitstrm);
  ihevcd_bits_get(ps_bitstrm,1);
  return 0;
}

Assistant:

IHEVCD_ERROR_T ihevcd_parse_vps(codec_t *ps_codec)
{
    IHEVCD_ERROR_T ret = (IHEVCD_ERROR_T)IHEVCD_SUCCESS;
    WORD32 i;
    WORD32 value;
    WORD32 vps_id;
    vps_t *ps_vps;
    bitstrm_t *ps_bitstrm = &ps_codec->s_parse.s_bitstrm;
    BITS_PARSE("vps_video_parameter_set_id", value, ps_bitstrm, 4);
    vps_id = value;

    if(vps_id >= MAX_VPS_CNT)
    {
        ps_codec->s_parse.i4_error_code = IHEVCD_UNSUPPORTED_VPS_ID;
        return IHEVCD_UNSUPPORTED_VPS_ID;
    }


    ps_vps = (ps_codec->s_parse.ps_vps_base + vps_id);

    ps_vps->i1_vps_id = vps_id;

    BITS_PARSE("vps_reserved_three_2bits", value, ps_bitstrm, 2);
    ASSERT(value == 3);

    BITS_PARSE("vps_max_layers_minus1", value, ps_bitstrm, 6);
    //ps_vps->i1_vps_max_layers = value + 1;



    BITS_PARSE("vps_max_sub_layers_minus1", value, ps_bitstrm, 3);
    ps_vps->i1_vps_max_sub_layers = value + 1;

    ASSERT(ps_vps->i1_vps_max_sub_layers < VPS_MAX_SUB_LAYERS);

    BITS_PARSE("vps_temporal_id_nesting_flag", value, ps_bitstrm, 1);
    ps_vps->i1_vps_temporal_id_nesting_flag = value;

    BITS_PARSE("vps_reserved_ffff_16bits", value, ps_bitstrm, 16);
    ASSERT(value == 0xFFFF);
    // profile_and_level( 1, vps_max_sub_layers_minus1 )
    ret = ihevcd_profile_tier_level(ps_bitstrm, &(ps_vps->s_ptl),
                                    1, (ps_vps->i1_vps_max_sub_layers - 1));

    BITS_PARSE("vps_sub_layer_ordering_info_present_flag", value, ps_bitstrm, 1);
    ps_vps->i1_sub_layer_ordering_info_present_flag = value;
    i = (ps_vps->i1_sub_layer_ordering_info_present_flag ?
                    0 : (ps_vps->i1_vps_max_sub_layers - 1));
    for(; i < ps_vps->i1_vps_max_sub_layers; i++)
    {
        UEV_PARSE("vps_max_dec_pic_buffering[i]", value, ps_bitstrm);
        ps_vps->ai1_vps_max_dec_pic_buffering[i] = value;

        /* vps_num_reorder_pics (no max) used in print in order to match with HM */
        UEV_PARSE("vps_num_reorder_pics[i]", value, ps_bitstrm);
        ps_vps->ai1_vps_max_num_reorder_pics[i] = value;

        UEV_PARSE("vps_max_latency_increase[i]", value, ps_bitstrm);
        ps_vps->ai1_vps_max_latency_increase[i] = value;
    }



    BITS_PARSE("vps_max_layer_id", value, ps_bitstrm, 6);
    //ps_vps->i1_vps_max_layer_id  = value;

    UEV_PARSE("vps_num_layer_sets_minus1", value, ps_bitstrm);
    //ps_vps->i1_vps_num_layer_sets  = value + 1;

    BITS_PARSE("vps_timing_info_present_flag", value, ps_bitstrm, 1);
    //ps_vps->i1_vps_timing_info_present_flag  = value;



    return ret;
}